

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
header_inclusion_html_actions::module_start(header_inclusion_html_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  header_inclusion_html_actions *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  <h2>From <a href=\"");
  poVar1 = std::operator<<(poVar1,(string *)module);
  poVar1 = std::operator<<(poVar1,".html\"><em>");
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,"</em></a></h2><ul>\n");
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << "  <h2>From <a href=\"" << module << ".html\"><em>" << module << "</em></a></h2><ul>\n";
    }